

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void makeMaps_e(EState *s)

{
  int local_14;
  Int32 i;
  EState *s_local;
  
  s->nInUse = 0;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if (s->inUse[local_14] != '\0') {
      s->unseqToSeq[local_14] = (UChar)s->nInUse;
      s->nInUse = s->nInUse + 1;
    }
  }
  return;
}

Assistant:

static
void makeMaps_e ( EState* s )
{
   Int32 i;
   s->nInUse = 0;
   for (i = 0; i < 256; i++)
      if (s->inUse[i]) {
         s->unseqToSeq[i] = s->nInUse;
         s->nInUse++;
      }
}